

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_initializers.cpp
# Opt level: O0

void linker::set_uniform_initializer
               (void *mem_ctx,gl_shader_program *prog,char *name,glsl_type *type,ir_constant *val,
               uint boolean_true)

{
  undefined8 uVar1;
  gl_constant_value *storage_00;
  glsl_type *pgVar2;
  bool bVar3;
  glsl_base_type gVar4;
  int iVar5;
  uint uVar6;
  glsl_type *pgVar7;
  ir_constant *val_00;
  char *pcVar8;
  gl_uniform_storage *pgVar9;
  uint index;
  gl_linked_shader *shader;
  int sh;
  uint i_2;
  uint dmul;
  uint idx;
  uint elements;
  glsl_base_type base_type;
  gl_uniform_storage *storage;
  char *element_name;
  uint i_1;
  glsl_type *element_type;
  char *field_name;
  glsl_type *field_type;
  uint i;
  glsl_type *t_without_array;
  uint boolean_true_local;
  ir_constant *val_local;
  glsl_type *type_local;
  char *name_local;
  gl_shader_program *prog_local;
  void *mem_ctx_local;
  
  pgVar7 = glsl_type::without_array(type);
  bVar3 = glsl_type::is_struct(type);
  if (bVar3) {
    for (field_type._4_4_ = 0; field_type._4_4_ < type->length;
        field_type._4_4_ = field_type._4_4_ + 1) {
      pgVar7 = *(glsl_type **)((type->fields).array + field_type._4_4_);
      pgVar2 = (type->fields).array + field_type._4_4_;
      uVar1._0_1_ = pgVar2->vector_elements;
      uVar1._1_1_ = pgVar2->matrix_columns;
      uVar1._2_2_ = *(undefined2 *)&pgVar2->field_0xa;
      uVar1._4_4_ = pgVar2->length;
      pcVar8 = ralloc_asprintf(mem_ctx,"%s.%s",name,uVar1);
      val_00 = ir_constant::get_record_field(val,field_type._4_4_);
      set_uniform_initializer(mem_ctx,prog,pcVar8,pgVar7,val_00,boolean_true);
    }
  }
  else {
    bVar3 = glsl_type::is_struct(pgVar7);
    if ((bVar3) ||
       ((bVar3 = glsl_type::is_array(type), bVar3 &&
        (bVar3 = glsl_type::is_array((type->fields).array), bVar3)))) {
      pgVar7 = (type->fields).array;
      for (element_name._4_4_ = 0; element_name._4_4_ < type->length;
          element_name._4_4_ = element_name._4_4_ + 1) {
        pcVar8 = ralloc_asprintf(mem_ctx,"%s[%d]",name,(ulong)element_name._4_4_);
        set_uniform_initializer
                  (mem_ctx,prog,pcVar8,pgVar7,val->const_elements[element_name._4_4_],boolean_true);
      }
    }
    else {
      pgVar9 = get_storage(prog,name);
      if (pgVar9 != (gl_uniform_storage *)0x0) {
        bVar3 = glsl_type::is_array((val->super_ir_rvalue).type);
        if (bVar3) {
          gVar4 = *(glsl_base_type *)&(((*val->const_elements)->super_ir_rvalue).type)->field_0x4 &
                  0xff;
          uVar6 = glsl_type::components(((*val->const_elements)->super_ir_rvalue).type);
          i_2 = 0;
          bVar3 = glsl_base_type_is_64bit(gVar4);
          iVar5 = 1;
          if (bVar3) {
            iVar5 = 2;
          }
          if (((val->super_ir_rvalue).type)->length < pgVar9->array_elements) {
            __assert_fail("val->type->length >= storage->array_elements",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_initializers.cpp"
                          ,0xe5,
                          "void linker::set_uniform_initializer(void *, gl_shader_program *, const char *, const glsl_type *, ir_constant *, unsigned int)"
                         );
          }
          for (shader._4_4_ = 0; shader._4_4_ < pgVar9->array_elements;
              shader._4_4_ = shader._4_4_ + 1) {
            copy_constant_to_storage
                      (pgVar9->storage + i_2,val->const_elements[shader._4_4_],gVar4,uVar6,
                       boolean_true);
            i_2 = uVar6 * iVar5 + i_2;
          }
        }
        else {
          storage_00 = pgVar9->storage;
          gVar4 = *(glsl_base_type *)&((val->super_ir_rvalue).type)->field_0x4;
          uVar6 = glsl_type::components((val->super_ir_rvalue).type);
          copy_constant_to_storage(storage_00,val,gVar4 & 0xff,uVar6,boolean_true);
          bVar3 = glsl_type::is_sampler(pgVar9->type);
          if (bVar3) {
            for (shader._0_4_ = 0; (int)shader < 6; shader._0_4_ = (int)shader + 1) {
              if ((prog->_LinkedShaders[(int)shader] != (gl_linked_shader *)0x0) &&
                 ((pgVar9->opaque[(int)shader].active & 1U) != 0)) {
                prog->_LinkedShaders[(int)shader]->Program->SamplerUnits
                [pgVar9->opaque[(int)shader].index] = (GLubyte)pgVar9->storage->b;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
set_uniform_initializer(void *mem_ctx, gl_shader_program *prog,
                        const char *name, const glsl_type *type,
                        ir_constant *val, unsigned int boolean_true)
{
   const glsl_type *t_without_array = type->without_array();
   if (type->is_struct()) {
      for (unsigned int i = 0; i < type->length; i++) {
         const glsl_type *field_type = type->fields.structure[i].type;
         const char *field_name = ralloc_asprintf(mem_ctx, "%s.%s", name,
                                            type->fields.structure[i].name);
         set_uniform_initializer(mem_ctx, prog, field_name,
                                 field_type, val->get_record_field(i),
                                 boolean_true);
      }
      return;
   } else if (t_without_array->is_struct() ||
              (type->is_array() && type->fields.array->is_array())) {
      const glsl_type *const element_type = type->fields.array;

      for (unsigned int i = 0; i < type->length; i++) {
         const char *element_name = ralloc_asprintf(mem_ctx, "%s[%d]", name, i);

         set_uniform_initializer(mem_ctx, prog, element_name,
                                 element_type, val->const_elements[i],
                                 boolean_true);
      }
      return;
   }

   struct gl_uniform_storage *const storage = get_storage(prog, name);

   if (!storage)
      return;

   if (val->type->is_array()) {
      const enum glsl_base_type base_type =
         val->const_elements[0]->type->base_type;
      const unsigned int elements = val->const_elements[0]->type->components();
      unsigned int idx = 0;
      unsigned dmul = glsl_base_type_is_64bit(base_type) ? 2 : 1;

      assert(val->type->length >= storage->array_elements);
      for (unsigned int i = 0; i < storage->array_elements; i++) {
         copy_constant_to_storage(& storage->storage[idx],
                                  val->const_elements[i],
                                  base_type,
                                  elements,
                                  boolean_true);

         idx += elements * dmul;
      }
   } else {
      copy_constant_to_storage(storage->storage,
                               val,
                               val->type->base_type,
                               val->type->components(),
                               boolean_true);

      if (storage->type->is_sampler()) {
         for (int sh = 0; sh < MESA_SHADER_STAGES; sh++) {
            gl_linked_shader *shader = prog->_LinkedShaders[sh];

            if (shader && storage->opaque[sh].active) {
               unsigned index = storage->opaque[sh].index;

               shader->Program->SamplerUnits[index] = storage->storage[0].i;
            }
         }
      }
   }
}